

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O0

int Cmd_CommandAbcLoadPlugIn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Ptr_t *pVVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 local_460;
  FILE *pFile_1;
  char pBuffer [1000];
  char *local_68;
  char *pTempFile;
  Vec_Str_t *sCommandLine;
  char *pStrSection;
  char *pStrDirBin;
  FILE *pFile;
  int local_38;
  int c;
  int RetValue;
  int fd;
  int fVerbose;
  int fPath;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  c = -1;
  local_38 = -1;
  pStrDirBin = (char *)0x0;
  pStrSection = (char *)0x0;
  sCommandLine = (Vec_Str_t *)0x0;
  pTempFile = (char *)0x0;
  local_68 = (char *)0x0;
  fd = 0;
  RetValue = 0;
  _fVerbose = argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  while (pFile._4_4_ = Extra_UtilGetopt(argv_local._4_4_,_fVerbose,"vph"), pFile._4_4_ != -1) {
    if (pFile._4_4_ == 0x70) {
      fd = fd ^ 1;
    }
    else {
      if (pFile._4_4_ != 0x76) goto LAB_00b20e42;
      RetValue = RetValue ^ 1;
    }
  }
  if (argv_local._4_4_ != globalUtilOptind + 2) {
LAB_00b20e42:
    Abc_Print(-2,"usage: load_plugin [-pvh] <plugin_dir\\binary_name> <section_name>\n");
    Abc_Print(-2,"\t        loads external binary as a plugin\n");
    pcVar3 = "no";
    if (fd != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-p    : toggle searching the command in PATH [default = %s].\n",pcVar3);
    pcVar3 = "no";
    if (RetValue != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-v    : enable verbose output [default = %s].\n",pcVar3);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    return 1;
  }
  pStrSection = _fVerbose[argv_local._4_4_ + -2];
  sCommandLine = (Vec_Str_t *)_fVerbose[argv_local._4_4_ + -1];
  if (fd == 0) {
    local_460 = fopen(pStrSection,"r");
    if (local_460 == (FILE *)0x0) {
      Abc_Print(-1,"Cannot run the binary \"%s\". File does not exist.\n",pStrSection);
      goto LAB_00b20df0;
    }
    fclose(local_460);
  }
  c = Util_SignalTmpFile("__abctmp_",".txt",&local_68);
  if (c == -1) {
    Abc_Print(-1,"Cannot create a temporary file.\n");
  }
  else {
    close(c);
    pTempFile = (char *)Vec_StrAlloc(1000);
    Vec_StrPrintF((Vec_Str_t *)pTempFile,"%s -abc -list-commands > %s",pStrSection,local_68);
    Vec_StrPush((Vec_Str_t *)pTempFile,'\0');
    if (RetValue != 0) {
      pcVar3 = Vec_StrArray((Vec_Str_t *)pTempFile);
      Abc_Print(2,"Running command %s\n",pcVar3);
    }
    pcVar3 = Vec_StrArray((Vec_Str_t *)pTempFile);
    local_38 = Util_SignalSystem(pcVar3);
    if (local_38 == 0) {
      pStrDirBin = (char *)fopen(local_68,"r");
      if ((FILE *)pStrDirBin == (FILE *)0x0) {
        Abc_Print(-1,"Cannot open file with the list of commands.\n");
        local_38 = -1;
      }
      else {
        while (pcVar3 = fgets((char *)&pFile_1,1000,(FILE *)pStrDirBin), pcVar3 != (char *)0x0) {
          sVar2 = strlen((char *)&pFile_1);
          if (*(char *)((long)&local_460 + sVar2 + 7) == '\n') {
            sVar2 = strlen((char *)&pFile_1);
            *(undefined1 *)((long)&local_460 + sVar2 + 7) = 0;
          }
          Cmd_CommandAdd(pAStack_18,(char *)sCommandLine,(char *)&pFile_1,Cmd_CommandAbcPlugIn,1);
          pVVar1 = pAStack_18->vPlugInComBinPairs;
          pcVar3 = Extra_UtilStrsav((char *)&pFile_1);
          Vec_PtrPush(pVVar1,pcVar3);
          pVVar1 = pAStack_18->vPlugInComBinPairs;
          pcVar3 = Extra_UtilStrsav(pStrSection);
          Vec_PtrPush(pVVar1,pcVar3);
          if (RetValue != 0) {
            Abc_Print(2,"Creating command %s with binary %s\n",&pFile_1,pStrSection);
          }
        }
      }
    }
    else {
      pcVar3 = Vec_StrArray((Vec_Str_t *)pTempFile);
      Abc_Print(-1,"Command \"%s\" failed.\n",pcVar3);
    }
  }
LAB_00b20df0:
  if (pStrDirBin != (char *)0x0) {
    fclose((FILE *)pStrDirBin);
  }
  if (local_68 != (char *)0x0) {
    Util_SignalTmpFileRemove(local_68,0);
  }
  Vec_StrFreeP((Vec_Str_t **)&pTempFile);
  if (local_68 != (char *)0x0) {
    free(local_68);
  }
  return local_38;
}

Assistant:

int Cmd_CommandAbcLoadPlugIn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int fPath, fVerbose;
    int fd = -1, RetValue = -1, c;
    FILE * pFile = NULL;
    char * pStrDirBin = NULL, * pStrSection = NULL;
    Vec_Str_t * sCommandLine = NULL;
    char * pTempFile = NULL;
    char pBuffer[1000];

    // set defaults
    fPath = 0;
    fVerbose = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vph" ) ) != EOF )
    {
        switch ( c )
        {
        case 'p':
            fPath ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
        goto usage;
    }
    }

    if ( argc != globalUtilOptind + 2 )
        goto usage;

    pStrDirBin  = argv[argc-2];
    pStrSection = argv[argc-1];

    // check if the file exists
    if ( !fPath )
    {
        FILE* pFile = fopen( pStrDirBin, "r" );

        if ( !pFile )
        {
            Abc_Print( ABC_ERROR, "Cannot run the binary \"%s\". File does not exist.\n", pStrDirBin );
            goto cleanup;
    }

    fclose( pFile );
    }

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".txt", &pTempFile );

    if ( fd == -1 )
    {
        Abc_Print( ABC_ERROR, "Cannot create a temporary file.\n" );
        goto cleanup;
    }

#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif

    // get command list
    sCommandLine = Vec_StrAlloc(1000);

    Vec_StrPrintF(sCommandLine, "%s -abc -list-commands > %s", pStrDirBin, pTempFile );
    Vec_StrPush(sCommandLine, '\0');

    if(fVerbose)
    {
        Abc_Print(ABC_VERBOSE, "Running command %s\n", Vec_StrArray(sCommandLine));
    }

    RetValue = Util_SignalSystem( Vec_StrArray(sCommandLine) );

    if ( RetValue != 0 )
    {
        Abc_Print( ABC_ERROR, "Command \"%s\" failed.\n", Vec_StrArray(sCommandLine) );
        goto cleanup;
    }

    // create commands
    pFile = fopen( pTempFile, "r" );

    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open file with the list of commands.\n" );

        RetValue = -1;
        goto cleanup;
    }

    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        if ( pBuffer[strlen(pBuffer)-1] == '\n' )
            pBuffer[strlen(pBuffer)-1] = 0;

        Cmd_CommandAdd( pAbc, pStrSection, pBuffer, Cmd_CommandAbcPlugIn, 1 );

        Vec_PtrPush( pAbc->vPlugInComBinPairs, Extra_UtilStrsav(pBuffer) );
        Vec_PtrPush( pAbc->vPlugInComBinPairs, Extra_UtilStrsav(pStrDirBin) );

        if ( fVerbose )
        {
            Abc_Print(ABC_VERBOSE, "Creating command %s with binary %s\n", pBuffer, pStrDirBin);
    }
    }

cleanup:

    if( pFile )
    fclose( pFile );

    if( pTempFile )
    Util_SignalTmpFileRemove( pTempFile, 0 );

    Vec_StrFreeP(&sCommandLine);

    ABC_FREE( pTempFile );

    return RetValue;

usage:

    Abc_Print( -2, "usage: load_plugin [-pvh] <plugin_dir\\binary_name> <section_name>\n" );
    Abc_Print( -2, "\t        loads external binary as a plugin\n" );
    Abc_Print( -2, "\t-p    : toggle searching the command in PATH [default = %s].\n", fPath? "yes": "no" );
    Abc_Print( -2, "\t-v    : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");

    return 1;
}